

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O2

void arena_tcache_fill_small
               (tsdn_t *tsdn,arena_t *arena,tcache_t *tcache,cache_bin_t *tbin,szind_t binind,
               uint64_t prof_accumbytes)

{
  uint64_t *puVar1;
  int iVar2;
  extent_t *peVar3;
  ulong uVar4;
  void **ppvVar5;
  size_t sVar6;
  uint uVar7;
  uint uVar8;
  bin_t *bin;
  ulong uVar9;
  void *pvVar10;
  ticker_t *ptVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar15;
  bitmap_t bVar16;
  uint uVar17;
  long lVar18;
  ulong uVar19;
  uint uVar20;
  ulong uVar21;
  uint binshard;
  ulong uVar14;
  
  bin = arena_bin_choose_lock(tsdn,arena,binind,&binshard);
  uVar13 = tcache_bin_info[binind].ncached_max >> (tcache->lg_fill_div[binind] & 0x1f);
  uVar14 = (ulong)uVar13;
  uVar8 = 0;
  do {
    uVar21 = (ulong)uVar8;
    uVar12 = uVar13 - uVar8;
    if (uVar13 < uVar8 || uVar12 == 0) {
LAB_0010f803:
      (bin->stats).nmalloc = (bin->stats).nmalloc + uVar21;
      puVar1 = &(bin->stats).nrequests;
      *puVar1 = *puVar1 + (tbin->tstats).nrequests;
      (bin->stats).curregs = uVar21 + (bin->stats).curregs;
      (bin->stats).nfills = (bin->stats).nfills + 1;
      (tbin->tstats).nrequests = 0;
      (bin->lock).field_0.field_0.locked.repr = false;
      pthread_mutex_unlock((pthread_mutex_t *)((long)&(bin->lock).field_0 + 0x40));
      tbin->ncached = uVar8;
      if (tsdn != (tsdn_t *)0x0) {
        ptVar11 = decay_ticker_get(&tsdn->tsd,arena->base->ind);
        if ((ptVar11 != (ticker_t *)0x0) &&
           (iVar2 = ptVar11->tick, ptVar11->tick = iVar2 + -1, iVar2 < 1)) {
          ptVar11->tick = ptVar11->nticks;
          arena_decay(tsdn,arena,false,false);
          return;
        }
      }
      return;
    }
    peVar3 = bin->slabcur;
    if (peVar3 == (extent_t *)0x0) {
LAB_0010f787:
      pvVar10 = arena_bin_malloc_hard(tsdn,arena,bin,binind,binshard);
      if (pvVar10 == (void *)0x0) {
        if (uVar8 != 0) {
          memmove(tbin->avail + -uVar21,tbin->avail + -uVar14,uVar21 * 8);
        }
        goto LAB_0010f803;
      }
      tbin->avail[uVar21 - uVar14] = pvVar10;
      uVar7 = 1;
    }
    else {
      uVar4 = peVar3->e_bits;
      uVar9 = uVar4 >> 0x1a;
      uVar7 = (uint)uVar9 & 0x3ff;
      if ((uVar9 & 0x3ff) == 0) goto LAB_0010f787;
      if (uVar12 < uVar7) {
        uVar7 = uVar12;
      }
      ppvVar5 = tbin->avail;
      bVar16 = (peVar3->field_5).e_slab_data.bitmap[0];
      uVar9 = 0;
      uVar15 = 0;
      while (uVar12 = uVar7 - (uint)uVar9, (uint)uVar9 <= uVar7 && uVar12 != 0) {
        uVar20 = (int)uVar15 << 6;
        while (bVar16 == 0) {
          uVar15 = (ulong)((int)uVar15 + 1);
          uVar20 = uVar20 + 0x40;
          bVar16 = *(ulong *)((long)&peVar3->field_5 + uVar15 * 8);
        }
        uVar19 = bVar16 - (bVar16 >> 1 & 0x5555555555555555);
        uVar19 = (uVar19 >> 2 & 0x3333333333333333) + (uVar19 & 0x3333333333333333);
        uVar17 = (uint)(byte)(((uVar19 >> 4) + uVar19 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >>
                             0x38);
        if (uVar12 < uVar17) {
          uVar17 = uVar12;
        }
        pvVar10 = peVar3->e_addr;
        sVar6 = bin_infos[binind].reg_size;
        for (lVar18 = -(ulong)uVar17; lVar18 != 0; lVar18 = lVar18 + 1) {
          uVar19 = 0;
          if (bVar16 != 0) {
            for (; (bVar16 >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
            }
          }
          if (bVar16 == 0) {
            uVar19 = 0xffffffff;
          }
          bVar16 = bVar16 ^ 1L << (uVar19 & 0x3f);
          ppvVar5[(uVar21 + uVar9) - uVar14] = (void *)((uVar19 + uVar20) * sVar6 + (long)pvVar10);
          uVar9 = (ulong)((int)uVar9 + 1);
        }
        *(bitmap_t *)((long)&peVar3->field_5 + uVar15 * 8) = bVar16;
      }
      peVar3->e_bits = uVar4 + (ulong)uVar7 * -0x4000000;
    }
    uVar8 = uVar7 + uVar8;
  } while( true );
}

Assistant:

void
arena_tcache_fill_small(tsdn_t *tsdn, arena_t *arena, tcache_t *tcache,
    cache_bin_t *tbin, szind_t binind, uint64_t prof_accumbytes) {
	unsigned i, nfill, cnt;

	assert(tbin->ncached == 0);

	if (config_prof && arena_prof_accum(tsdn, arena, prof_accumbytes)) {
		prof_idump(tsdn);
	}

	unsigned binshard;
	bin_t *bin = arena_bin_choose_lock(tsdn, arena, binind, &binshard);

	for (i = 0, nfill = (tcache_bin_info[binind].ncached_max >>
	    tcache->lg_fill_div[binind]); i < nfill; i += cnt) {
		extent_t *slab;
		if ((slab = bin->slabcur) != NULL && extent_nfree_get(slab) >
		    0) {
			unsigned tofill = nfill - i;
			cnt = tofill < extent_nfree_get(slab) ?
				tofill : extent_nfree_get(slab);
			arena_slab_reg_alloc_batch(
			   slab, &bin_infos[binind], cnt,
			   tbin->avail - nfill + i);
		} else {
			cnt = 1;
			void *ptr = arena_bin_malloc_hard(tsdn, arena, bin,
			    binind, binshard);
			/*
			 * OOM.  tbin->avail isn't yet filled down to its first
			 * element, so the successful allocations (if any) must
			 * be moved just before tbin->avail before bailing out.
			 */
			if (ptr == NULL) {
				if (i > 0) {
					memmove(tbin->avail - i,
						tbin->avail - nfill,
						i * sizeof(void *));
				}
				break;
			}
			/* Insert such that low regions get used first. */
			*(tbin->avail - nfill + i) = ptr;
		}
		if (config_fill && unlikely(opt_junk_alloc)) {
			for (unsigned j = 0; j < cnt; j++) {
				void* ptr = *(tbin->avail - nfill + i + j);
				arena_alloc_junk_small(ptr, &bin_infos[binind],
							true);
			}
		}
	}
	if (config_stats) {
		bin->stats.nmalloc += i;
		bin->stats.nrequests += tbin->tstats.nrequests;
		bin->stats.curregs += i;
		bin->stats.nfills++;
		tbin->tstats.nrequests = 0;
	}
	malloc_mutex_unlock(tsdn, &bin->lock);
	tbin->ncached = i;
	arena_decay_tick(tsdn, arena);
}